

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConversionFuncs.cpp
# Opt level: O0

Type * __thiscall
slang::ast::builtins::ItoRFunction::checkArguments
          (ItoRFunction *this,ASTContext *context,Args *args,SourceRange range,Expression *param_5)

{
  bool bVar1;
  Compilation *this_00;
  SystemSubroutine *in_RDX;
  Args *in_R8;
  ASTContext *in_R9;
  ASTContext *unaff_retaddr;
  SystemSubroutine *in_stack_00000008;
  undefined1 in_stack_00000010 [16];
  size_t in_stack_00000030;
  Compilation *comp;
  Type *pTVar2;
  undefined8 in_stack_fffffffffffffff8;
  undefined1 isMethod;
  
  isMethod = (undefined1)((ulong)in_stack_fffffffffffffff8 >> 0x38);
  this_00 = ASTContext::getCompilation((ASTContext *)0x92c236);
  pTVar2 = (Type *)0x1;
  bVar1 = SystemSubroutine::checkArgCount
                    (in_stack_00000008,unaff_retaddr,(bool)isMethod,in_R8,
                     (SourceRange)in_stack_00000010,in_stack_00000030,(size_t)comp);
  if (bVar1) {
    std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
              ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)in_RDX,0);
    not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0x92c2af);
    bVar1 = Type::isNumeric(pTVar2);
    if (bVar1) {
      pTVar2 = Compilation::getRealType(this_00);
    }
    else {
      std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)in_RDX,0);
      pTVar2 = SystemSubroutine::badArg(in_RDX,in_R9,(Expression *)this_00);
    }
  }
  else {
    pTVar2 = Compilation::getErrorType(this_00);
  }
  return pTVar2;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, false, args, range, 1, 1))
            return comp.getErrorType();

        if (!args[0]->type->isNumeric())
            return badArg(context, *args[0]);

        return comp.getRealType();
    }